

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void fts5IndexCloseReader(Fts5Index *p)

{
  sqlite3_blob *pBlob;
  int iVar1;
  
  pBlob = p->pReader;
  if (pBlob != (sqlite3_blob *)0x0) {
    p->pReader = (sqlite3_blob *)0x0;
    iVar1 = sqlite3_blob_close(pBlob);
    if (p->rc == 0) {
      p->rc = iVar1;
    }
  }
  return;
}

Assistant:

static void fts5IndexCloseReader(Fts5Index *p){
  if( p->pReader ){
    int rc;
    sqlite3_blob *pReader = p->pReader;
    p->pReader = 0;
    rc = sqlite3_blob_close(pReader);
    if( p->rc==SQLITE_OK ) p->rc = rc;
  }
}